

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::Postprocess_BuildMeshSet
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray,CAMFImporter_NodeElement_Color *pObjectColor,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode *pSceneNode)

{
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar1;
  EType EVar2;
  int iVar3;
  uint uVar4;
  CAMFImporter_NodeElement_Color *pCVar5;
  undefined8 uVar6;
  pointer __src;
  _List_node_base *__new_size;
  bool bVar7;
  size_t i;
  aiMesh *paVar8;
  ulong *puVar9;
  aiFace *paVar10;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  *pFaceList;
  const_reference pvVar11;
  long lVar12;
  reference pvVar13;
  void *pvVar14;
  size_t sVar15;
  reference __x;
  aiVector3D *paVar16;
  aiColor4D *__s;
  uint *puVar17;
  DeadlyImportError *this_00;
  _List_node_base *p_Var18;
  aiFace *pIdx_To;
  size_t *pBiggerThan;
  size_t *extraout_RDX;
  size_t *pBiggerThan_00;
  const_iterator mit;
  long *plVar19;
  _List_node_base *p_Var20;
  ulong uVar21;
  _Alloc_hider _Var22;
  CAMFImporter_NodeElement_Color ***pppCVar23;
  long lVar24;
  CAMFImporter_NodeElement_Triangle *tri_al;
  ulong uVar25;
  aiMesh *tmesh;
  allocator local_199;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vert_arr;
  _List_node_base *local_178;
  size_type local_170;
  size_t vert_idx_to;
  _List_node_base *p_Stack_160;
  AMFImporter *local_150;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_arr;
  anon_class_40_5_b0e7ad54 Vertex_CalculateColor;
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  complex_faces_toplist;
  SPP_Material *cur_mat;
  CAMFImporter_NodeElement_Color *ne_volume_color;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  complex_faces_list;
  list<unsigned_int,_std::allocator<unsigned_int>_> mesh_idx;
  string local_80;
  _Alloc_hider local_60;
  _List_node_base *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _List_node_base *local_40;
  CAMFImporter_NodeElement_Color *pObjectColor_local;
  
  mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&mesh_idx;
  mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size = 0
  ;
  local_58 = (_List_node_base *)&(pNodeElement->super_CAMFImporter_NodeElement).Child;
  _Var22._M_p = (pointer)local_58;
  local_150 = this;
  mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  local_50._M_allocated_capacity = (size_type)pMeshList;
  local_50._8_8_ = pVertexColorArray;
  pObjectColor_local = pObjectColor;
  do {
    do {
      sVar15 = mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               _M_node._M_size;
      p_Var18 = mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      _Var22._M_p = (pointer)(((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                                *)&((_List_node_base *)_Var22._M_p)->_M_next)->_M_impl)._M_node.
                             super__List_node_base._M_next;
      if ((_List_node_base *)_Var22._M_p == local_58) {
        if (mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
            super__List_node_base._M_next != (_List_node_base *)&mesh_idx) {
          pSceneNode->mNumMeshes =
               (uint)mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     _M_node._M_size;
          puVar17 = (uint *)operator_new__((mesh_idx.
                                            super__List_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl._M_node._M_size & 0xffffffff) << 2);
          pSceneNode->mMeshes = puVar17;
          for (uVar25 = 0; uVar25 < (sVar15 & 0xffffffff); uVar25 = uVar25 + 1) {
            p_Var20 = p_Var18 + 1;
            p_Var18 = p_Var18->_M_next;
            pSceneNode->mMeshes[uVar25] = *(uint *)&p_Var20->_M_next;
            sVar15 = (size_t)pSceneNode->mNumMeshes;
          }
        }
        std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
                  (&mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
        return;
      }
      lVar24 = (long)((_List_node_base *)((long)_Var22._M_p + 0x10))->_M_next;
      ne_volume_color = (CAMFImporter_NodeElement_Color *)0x0;
      cur_mat = (SPP_Material *)0x0;
    } while (*(int *)(lVar24 + 8) != 0xf);
    complex_faces_list.
    super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&complex_faces_list;
    complex_faces_list.
    super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
    ._M_impl._M_node._M_size = 0;
    complex_faces_toplist.
    super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&complex_faces_toplist;
    complex_faces_toplist.
    super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
    ._M_impl._M_node._M_size = 0;
    complex_faces_toplist.
    super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         complex_faces_toplist.
         super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    complex_faces_list.
    super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         complex_faces_list.
         super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_60._M_p = _Var22._M_p;
    if (*(long *)(lVar24 + 0x58) != 0) {
      this = local_150;
      bVar7 = Find_ConvertedMaterial(local_150,(string *)(lVar24 + 0x50),&cur_mat);
      if (!bVar7) {
        this = local_150;
        Throw_ID_NotFound(local_150,(string *)(lVar24 + 0x50));
      }
    }
    plVar19 = (long *)(lVar24 + 0x38);
    while (plVar19 = (long *)*plVar19, plVar19 != (long *)(lVar24 + 0x38)) {
      pCVar5 = (CAMFImporter_NodeElement_Color *)plVar19[2];
      EVar2 = (pCVar5->super_CAMFImporter_NodeElement).Type;
      if (EVar2 == ENET_Triangle) {
        Vertex_CalculateColor.cur_mat = (SPP_Material **)0x0;
        Vertex_CalculateColor.ne_volume_color = (CAMFImporter_NodeElement_Color **)0x0;
        Vertex_CalculateColor.pObjectColor = (CAMFImporter_NodeElement_Color **)0x0;
        if ((pCVar5->super_CAMFImporter_NodeElement).Child.
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size != 0) {
          plVar1 = &(pCVar5->super_CAMFImporter_NodeElement).Child;
          p_Var18 = (_List_node_base *)plVar1;
LAB_003b92cc:
          p_Var18 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                       *)&p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var18 != (_List_node_base *)plVar1) {
            iVar3 = *(int *)((long)p_Var18[1]._M_next + 8);
            pppCVar23 = &Vertex_CalculateColor.pObjectColor;
            if (iVar3 != 0) goto code_r0x003b92e2;
            goto LAB_003b92ef;
          }
        }
        Vertex_CalculateColor.pVertexColorArray =
             (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
              *)CONCAT44(Vertex_CalculateColor.pVertexColorArray._4_4_,3);
        Vertex_CalculateColor.ne_volume_color =
             (CAMFImporter_NodeElement_Color **)operator_new__(0xc);
        *(undefined4 *)Vertex_CalculateColor.ne_volume_color = *(undefined4 *)&pCVar5->Composed;
        *(undefined4 *)((long)Vertex_CalculateColor.ne_volume_color + 4) =
             *(undefined4 *)&pCVar5->Color_Composed[0]._M_dataplus._M_p;
        *(int *)(Vertex_CalculateColor.ne_volume_color + 1) =
             (int)pCVar5->Color_Composed[0]._M_string_length;
        std::__cxx11::
        list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
        ::push_back(&complex_faces_list,(value_type *)&Vertex_CalculateColor);
        this = (AMFImporter *)&Vertex_CalculateColor;
        aiFace::~aiFace((aiFace *)&Vertex_CalculateColor);
      }
      else if (EVar2 == ENET_Color) {
        ne_volume_color = pCVar5;
      }
    }
    PostprocessHelper_SplitFacesByTextureID(this,&complex_faces_list,&complex_faces_toplist);
    local_178 = (_List_node_base *)&complex_faces_toplist;
    while( true ) {
      local_178 = (((_List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                     *)&local_178->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (local_178 == (_List_node_base *)&complex_faces_toplist) break;
      Vertex_CalculateColor.pVertexColorArray =
           (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
            *)local_50._8_8_;
      Vertex_CalculateColor.ne_volume_color = &ne_volume_color;
      Vertex_CalculateColor.pObjectColor = &pObjectColor_local;
      Vertex_CalculateColor.cur_mat = &cur_mat;
      pIdx_To = (aiFace *)pVertexCoordinateArray;
      Vertex_CalculateColor.pVertexCoordinateArray = pVertexCoordinateArray;
      paVar8 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar8);
      paVar8->mPrimitiveTypes = 4;
      uVar25 = (ulong)local_178[2]._M_next;
      paVar8->mNumFaces = (uint)uVar25;
      uVar21 = uVar25 & 0xffffffff;
      tmesh = paVar8;
      puVar9 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
      *puVar9 = uVar21;
      paVar10 = (aiFace *)(puVar9 + 1);
      if (uVar21 != 0) {
        pIdx_To = paVar10;
        do {
          pIdx_To->mNumIndices = 0;
          pIdx_To->mIndices = (uint *)0x0;
          pIdx_To = pIdx_To + 1;
        } while (pIdx_To != paVar10 + uVar21);
      }
      vert_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar8->mFaces = paVar10;
      texcoord_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vert_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vert_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      texcoord_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      texcoord_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var20 = (_List_node_base *)(uVar25 * 6 & 0x1fffffffe);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&vert_arr,(size_type)p_Var20);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
                (&col_arr,(size_type)p_Var20);
      p_Var18 = local_178 + 1;
      vert_idx_to = 0;
      local_40 = p_Var20;
      pFaceList = (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                   *)Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)p_Var18,
                                (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                                 *)0x0,pBiggerThan);
      pvVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                          (pVertexCoordinateArray,(size_type)pFaceList);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&vert_arr,pvVar11);
      local_80._0_16_ =
           Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                     (&Vertex_CalculateColor,(size_t)pFaceList);
      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::emplace_back<aiColor4t<float>>
                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&col_arr,
                 (aiColor4t<float> *)&local_80);
      while( true ) {
        pBiggerThan_00 = (size_t *)vert_idx_to;
        if (pFaceList !=
            (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             *)vert_idx_to) {
          Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)p_Var18,pFaceList,vert_idx_to,(size_t)pIdx_To);
          pBiggerThan_00 = extraout_RDX;
        }
        pFaceList = (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                     *)Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)p_Var18,
                                  (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                                   *)&vert_idx_to,pBiggerThan_00);
        p_Var20 = p_Var18;
        if (pFaceList ==
            (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             *)vert_idx_to) break;
        pvVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                            (pVertexCoordinateArray,(size_type)pFaceList);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&vert_arr,pvVar11);
        local_80._0_16_ =
             Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                       (&Vertex_CalculateColor,(size_t)pFaceList);
        std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
        emplace_back<aiColor4t<float>>
                  ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&col_arr,
                   (aiColor4t<float> *)&local_80);
        vert_idx_to = vert_idx_to + 1;
      }
      while (__new_size = local_40, p_Var20 = p_Var20->_M_next, p_Var20 != p_Var18) {
        lVar24 = (long)p_Var20[2]._M_next;
        if (lVar24 != 0) {
          vert_idx_to = 0;
          p_Stack_160 = (_List_node_base *)0x0;
          if (*(char *)(lVar24 + 0x50) == '\x01') {
            this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string((string *)&local_80,"IME: face color composed",&local_199);
            DeadlyImportError::DeadlyImportError(this_00,&local_80);
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar12 = (long)vert_arr.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)vert_arr.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          vert_idx_to = *(size_t *)(lVar24 + 0xd8);
          p_Stack_160 = *(_List_node_base **)(lVar24 + 0xe0);
          for (uVar25 = 0; uVar25 < *(uint *)&p_Var20[1]._M_next; uVar25 = uVar25 + 1) {
            pvVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                (&vert_arr,
                                 (ulong)*(uint *)(*(long *)((long)(p_Var20 + 1) + 8) + uVar25 * 4));
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (&vert_arr,pvVar13);
            std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                      (&col_arr,(value_type *)&vert_idx_to);
            *(int *)(*(long *)((long)(p_Var20 + 1) + 8) + uVar25 * 4) =
                 (int)(lVar12 / 0xc) + (int)uVar25;
          }
        }
      }
      if (*(long *)((long)p_Var18->_M_next + 0x28) != 0) {
        local_170 = ((long)vert_arr.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vert_arr.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc;
        pvVar14 = operator_new__((ulong)local_40);
        for (p_Var20 = (_List_node_base *)0x0; __new_size != p_Var20;
            p_Var20 = (_List_node_base *)((long)&p_Var20->_M_next + 1)) {
          *(undefined1 *)((long)pvVar14 + (long)p_Var20) = 0;
        }
        lVar24 = *(long *)((long)p_Var18->_M_next + 0x28);
        sVar15 = PostprocessHelper_GetTextureID_Or_Create
                           (local_150,(string *)(lVar24 + 0x78),(string *)(lVar24 + 0x98),
                            (string *)(lVar24 + 0xb8),(string *)(lVar24 + 0xd8));
        tmesh->mMaterialIndex = (uint)sVar15;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&texcoord_arr,(size_type)__new_size);
        p_Var20 = p_Var18;
        while (p_Var20 = p_Var20->_M_next, p_Var20 != p_Var18) {
          lVar24 = 0x50;
          for (uVar25 = 0; uVar25 < *(uint *)&p_Var20[1]._M_next; uVar25 = uVar25 + 1) {
            uVar21 = (ulong)*(uint *)(*(long *)((long)(p_Var20 + 1) + 8) + uVar25 * 4);
            if (*(char *)((long)pvVar14 + uVar21) == '\0') {
              lVar12 = *(long *)((long)(p_Var20 + 2) + 8);
              pvVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                  (&texcoord_arr,uVar21);
              pvVar13->z = *(float *)(lVar12 + 8 + lVar24);
              uVar6 = *(undefined8 *)(lVar12 + lVar24);
              pvVar13->x = (float)(int)uVar6;
              pvVar13->y = (float)(int)((ulong)uVar6 >> 0x20);
              *(undefined1 *)((long)pvVar14 + uVar21) = 1;
            }
            else {
              pvVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                  (&texcoord_arr,uVar21);
              bVar7 = aiVector3t<float>::operator!=
                                (pvVar13,(aiVector3t<float> *)
                                         (*(long *)((long)(p_Var20 + 2) + 8) + lVar24));
              if (bVar7) {
                pvVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                    (&vert_arr,uVar21);
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                          (&vert_arr,pvVar13);
                __x = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::at
                                (&col_arr,uVar21);
                std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                          (&col_arr,__x);
                lVar12 = *(long *)((long)(p_Var20 + 2) + 8);
                pvVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                    (&texcoord_arr,local_170);
                pvVar13->z = *(float *)(lVar12 + 8 + lVar24);
                uVar6 = *(undefined8 *)(lVar12 + lVar24);
                pvVar13->x = (float)(int)uVar6;
                pvVar13->y = (float)(int)((ulong)uVar6 >> 0x20);
                *(int *)(*(long *)((long)(p_Var20 + 1) + 8) + uVar25 * 4) = (int)local_170;
                local_170 = local_170 + 1;
              }
            }
            lVar24 = lVar24 + 0xc;
          }
        }
        operator_delete__(pvVar14);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&texcoord_arr,local_170);
      }
      paVar8 = tmesh;
      tmesh->mNumVertices =
           (uint)(((long)vert_arr.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)vert_arr.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc);
      uVar4 = tmesh->mNumVertices;
      uVar25 = (ulong)uVar4 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar25);
      if (uVar4 != 0) {
        uVar25 = uVar25 - 0xc;
        memset(paVar16,0,(uVar25 - uVar25 % 0xc) + 0xc);
      }
      paVar8->mVertices = paVar16;
      uVar4 = paVar8->mNumVertices;
      uVar25 = (ulong)uVar4 << 4;
      __s = (aiColor4D *)operator_new__(uVar25);
      if (uVar4 != 0) {
        memset(__s,0,uVar25);
      }
      paVar8->mColors[0] = __s;
      memcpy(paVar8->mVertices,
             vert_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start,(ulong)paVar8->mNumVertices * 0xc);
      memcpy(tmesh->mColors[0],
             col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start,(ulong)tmesh->mNumVertices << 4);
      __src = texcoord_arr.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start;
      paVar8 = tmesh;
      if (texcoord_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          texcoord_arr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar4 = tmesh->mNumVertices;
        uVar25 = (ulong)uVar4 * 0xc;
        paVar16 = (aiVector3D *)operator_new__(uVar25);
        if (uVar4 != 0) {
          uVar25 = uVar25 - 0xc;
          memset(paVar16,0,(uVar25 - uVar25 % 0xc) + 0xc);
        }
        paVar8->mTextureCoords[0] = paVar16;
        memcpy(paVar16,__src,(ulong)paVar8->mNumVertices * 0xc);
        paVar8->mNumUVComponents[0] = 2;
      }
      uVar6 = local_50._M_allocated_capacity;
      lVar24 = 0;
      p_Var20 = p_Var18;
      while (p_Var20 = p_Var20->_M_next, p_Var20 != p_Var18) {
        aiFace::operator=((aiFace *)((long)&tmesh->mFaces->mNumIndices + lVar24),
                          (aiFace *)(p_Var20 + 1));
        lVar24 = lVar24 + 0x10;
      }
      local_80._M_dataplus._M_p._0_4_ = *(float *)(uVar6 + 0x10);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&mesh_idx,(value_type_conflict1 *)&local_80);
      std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)uVar6,&tmesh);
      std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
                (&col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&texcoord_arr.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&vert_arr.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
    }
    std::__cxx11::
    _List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
    ::_M_clear(&complex_faces_toplist.
                super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
              );
    this = (AMFImporter *)&complex_faces_list;
    std::__cxx11::
    _List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
    ::_M_clear((_List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                *)this);
    _Var22._M_p = local_60._M_p;
  } while( true );
code_r0x003b92e2:
  if (iVar3 == 0xb) {
    pppCVar23 = (CAMFImporter_NodeElement_Color ***)&Vertex_CalculateColor.cur_mat;
LAB_003b92ef:
    *pppCVar23 = (CAMFImporter_NodeElement_Color **)p_Var18[1]._M_next;
  }
  goto LAB_003b92cc;
}

Assistant:

void AMFImporter::Postprocess_BuildMeshSet(const CAMFImporter_NodeElement_Mesh& pNodeElement, const std::vector<aiVector3D>& pVertexCoordinateArray,
											const std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray,
											const CAMFImporter_NodeElement_Color* pObjectColor, std::list<aiMesh*>& pMeshList, aiNode& pSceneNode)
{
std::list<unsigned int> mesh_idx;

	// all data stored in "volume", search for it.
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		const CAMFImporter_NodeElement_Color* ne_volume_color = nullptr;
		const SPP_Material* cur_mat = nullptr;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
		{
			/******************* Get faces *******************/
			const CAMFImporter_NodeElement_Volume* ne_volume = reinterpret_cast<const CAMFImporter_NodeElement_Volume*>(ne_child);

			std::list<SComplexFace> complex_faces_list;// List of the faces of the volume.
			std::list<std::list<SComplexFace> > complex_faces_toplist;// List of the face list for every mesh.

			// check if volume use material
			if(!ne_volume->MaterialID.empty())
			{
				if(!Find_ConvertedMaterial(ne_volume->MaterialID, &cur_mat)) Throw_ID_NotFound(ne_volume->MaterialID);
			}

			// inside "volume" collect all data and place to arrays or create new objects
			for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)
			{
				// color for volume
				if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					ne_volume_color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_volume_child);
				}
				else if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Triangle)// triangles, triangles colors
				{
					const CAMFImporter_NodeElement_Triangle& tri_al = *reinterpret_cast<const CAMFImporter_NodeElement_Triangle*>(ne_volume_child);

					SComplexFace complex_face;

					// initialize pointers
					complex_face.Color = nullptr;
					complex_face.TexMap = nullptr;
					// get data from triangle children: color, texture coordinates.
					if(tri_al.Child.size())
					{
						for(const CAMFImporter_NodeElement* ne_triangle_child: tri_al.Child)
						{
							if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_Color)
								complex_face.Color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_triangle_child);
							else if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_TexMap)
								complex_face.TexMap = reinterpret_cast<const CAMFImporter_NodeElement_TexMap*>(ne_triangle_child);
						}
					}// if(tri_al.Child.size())

					// create new face and store it.
					complex_face.Face.mNumIndices = 3;
					complex_face.Face.mIndices = new unsigned int[3];
					complex_face.Face.mIndices[0] = static_cast<unsigned int>(tri_al.V[0]);
					complex_face.Face.mIndices[1] = static_cast<unsigned int>(tri_al.V[1]);
					complex_face.Face.mIndices[2] = static_cast<unsigned int>(tri_al.V[2]);
					complex_faces_list.push_back(complex_face);
				}
			}// for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)

			/**** Split faces list: one list per mesh ****/
			PostprocessHelper_SplitFacesByTextureID(complex_faces_list, complex_faces_toplist);

			/***** Create mesh for every faces list ******/
			for(std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
			{
				auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t
				{
					size_t rv;

					if(pBiggerThan != nullptr)
					{
						bool found = false;

						for(const SComplexFace& face: pFaceList)
						{
							for(size_t idx_vert = 0; idx_vert < face.Face.mNumIndices; idx_vert++)
							{
								if(face.Face.mIndices[idx_vert] > *pBiggerThan)
								{
									rv = face.Face.mIndices[idx_vert];
									found = true;

									break;
								}
							}

							if(found) break;
						}

						if(!found) return *pBiggerThan;
					}
					else
					{
						rv = pFaceList.front().Face.mIndices[0];
					}// if(pBiggerThan != nullptr) else

					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] < rv)
							{
								if(pBiggerThan != nullptr)
								{
									if(face.Face.mIndices[vi] > *pBiggerThan) rv = face.Face.mIndices[vi];
								}
								else
								{
									rv = face.Face.mIndices[vi];
								}
							}
						}
					}// for(const SComplexFace& face: pFaceList)

					return rv;
				};// auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t

				auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void
				{
					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] == pIdx_From) face.Face.mIndices[vi] = static_cast<unsigned int>(pIdx_To);
						}
					}
				};// auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void

				auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D
				{
					// Color priorities(In descending order):
					// 1. triangle color;
					// 2. vertex color;
					// 3. volume color;
					// 4. object color;
					// 5. material;
					// 6. default - invisible coat.
					//
					// Fill vertices colors in color priority list above that's points from 1 to 6.
					if((pIdx < pVertexColorArray.size()) && (pVertexColorArray[pIdx] != nullptr))// check for vertex color
					{
						if(pVertexColorArray[pIdx]->Composed)
							throw DeadlyImportError("IME: vertex color composed");
						else
							return pVertexColorArray[pIdx]->Color;
					}
					else if(ne_volume_color != nullptr)// check for volume color
					{
						if(ne_volume_color->Composed)
							throw DeadlyImportError("IME: volume color composed");
						else
							return ne_volume_color->Color;
					}
					else if(pObjectColor != nullptr)// check for object color
					{
						if(pObjectColor->Composed)
							throw DeadlyImportError("IME: object color composed");
						else
							return pObjectColor->Color;
					}
					else if(cur_mat != nullptr)// check for material
					{
						return cur_mat->GetColor(pVertexCoordinateArray.at(pIdx).x, pVertexCoordinateArray.at(pIdx).y, pVertexCoordinateArray.at(pIdx).z);
					}
					else// set default color.
					{
						return {0, 0, 0, 0};
					}// if((vi < pVertexColorArray.size()) && (pVertexColorArray[vi] != nullptr)) else

				};// auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D

				aiMesh* tmesh = new aiMesh;

				tmesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;// Only triangles is supported by AMF.
				//
				// set geometry and colors (vertices)
				//
				// copy faces/triangles
				tmesh->mNumFaces = static_cast<unsigned int>(face_list_cur.size());
				tmesh->mFaces = new aiFace[tmesh->mNumFaces];

				// Create vertices list and optimize indices. Optimisation mean following.In AMF all volumes use one big list of vertices. And one volume
				// can use only part of vertices list, for example: vertices list contain few thousands of vertices and volume use vertices 1, 3, 10.
				// Do you need all this thousands of garbage? Of course no. So, optimisation step transformate sparse indices set to continuous.
				size_t VertexCount_Max = tmesh->mNumFaces * 3;// 3 - triangles.
				std::vector<aiVector3D> vert_arr, texcoord_arr;
				std::vector<aiColor4D> col_arr;

				vert_arr.reserve(VertexCount_Max * 2);// "* 2" - see below TODO.
				col_arr.reserve(VertexCount_Max * 2);

				{// fill arrays
					size_t vert_idx_from, vert_idx_to;

					// first iteration.
					vert_idx_to = 0;
					vert_idx_from = VertexIndex_GetMinimal(face_list_cur, nullptr);
					vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
					col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
					if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					// rest iterations
					do
					{
						vert_idx_from = VertexIndex_GetMinimal(face_list_cur, &vert_idx_to);
						if(vert_idx_from == vert_idx_to) break;// all indices are transferred,

						vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
						col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
						vert_idx_to++;
						if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					} while(true);
				}// fill arrays. END.

				//
				// check if triangle colors are used and create additional faces if needed.
				//
				for(const SComplexFace& face_cur: face_list_cur)
				{
					if(face_cur.Color != nullptr)
					{
						aiColor4D face_color;
						size_t vert_idx_new = vert_arr.size();

						if(face_cur.Color->Composed)
							throw DeadlyImportError("IME: face color composed");
						else
							face_color = face_cur.Color->Color;

						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							vert_arr.push_back(vert_arr.at(face_cur.Face.mIndices[idx_ind]));
							col_arr.push_back(face_color);
							face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(vert_idx_new++);
						}
					}// if(face_cur.Color != nullptr)
				}// for(const SComplexFace& face_cur: face_list_cur)

				//
				// if texture is used then copy texture coordinates too.
				//
				if(face_list_cur.front().TexMap != nullptr)
				{
					size_t idx_vert_new = vert_arr.size();
					///TODO: clean unused vertices. "* 2": in certain cases - mesh full of triangle colors - vert_arr will contain duplicated vertices for
					/// colored triangles and initial vertices (for colored vertices) which in real became unused. This part need more thinking about
					/// optimisation.
					bool* idx_vert_used;

					idx_vert_used = new bool[VertexCount_Max * 2];
					for(size_t i = 0, i_e = VertexCount_Max * 2; i < i_e; i++) idx_vert_used[i] = false;

					// This ID's will be used when set materials ID in scene.
					tmesh->mMaterialIndex = static_cast<unsigned int>(PostprocessHelper_GetTextureID_Or_Create(face_list_cur.front().TexMap->TextureID_R,
																						face_list_cur.front().TexMap->TextureID_G,
																						face_list_cur.front().TexMap->TextureID_B,
																						face_list_cur.front().TexMap->TextureID_A));
					texcoord_arr.resize(VertexCount_Max * 2);
					for(const SComplexFace& face_cur: face_list_cur)
					{
						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							const size_t idx_vert = face_cur.Face.mIndices[idx_ind];

							if(!idx_vert_used[idx_vert])
							{
								texcoord_arr.at(idx_vert) = face_cur.TexMap->TextureCoordinate[idx_ind];
								idx_vert_used[idx_vert] = true;
							}
							else if(texcoord_arr.at(idx_vert) != face_cur.TexMap->TextureCoordinate[idx_ind])
							{
								// in that case one vertex is shared with many texture coordinates. We need to duplicate vertex with another texture
								// coordinates.
								vert_arr.push_back(vert_arr.at(idx_vert));
								col_arr.push_back(col_arr.at(idx_vert));
								texcoord_arr.at(idx_vert_new) = face_cur.TexMap->TextureCoordinate[idx_ind];
								face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(idx_vert_new++);
							}
						}// for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
					}// for(const SComplexFace& face_cur: face_list_cur)

					delete [] idx_vert_used;
					// shrink array
					texcoord_arr.resize(idx_vert_new);
				}// if(face_list_cur.front().TexMap != nullptr)

				//
				// copy collected data to mesh
				//
				tmesh->mNumVertices = static_cast<unsigned int>(vert_arr.size());
				tmesh->mVertices = new aiVector3D[tmesh->mNumVertices];
				tmesh->mColors[0] = new aiColor4D[tmesh->mNumVertices];

				memcpy(tmesh->mVertices, vert_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
				memcpy(tmesh->mColors[0], col_arr.data(), tmesh->mNumVertices * sizeof(aiColor4D));
				if(texcoord_arr.size() > 0)
				{
					tmesh->mTextureCoords[0] = new aiVector3D[tmesh->mNumVertices];
					memcpy(tmesh->mTextureCoords[0], texcoord_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
					tmesh->mNumUVComponents[0] = 2;// U and V stored in "x", "y" of aiVector3D.
				}

				size_t idx_face = 0;
				for(const SComplexFace& face_cur: face_list_cur) tmesh->mFaces[idx_face++] = face_cur.Face;

				// store new aiMesh
				mesh_idx.push_back(static_cast<unsigned int>(pMeshList.size()));
				pMeshList.push_back(tmesh);
			}// for(const std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
		}// if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)

	// if meshes was created then assign new indices with current aiNode
	if(!mesh_idx.empty())
	{
		std::list<unsigned int>::const_iterator mit = mesh_idx.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(mesh_idx.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *mit++;
	}// if(mesh_idx.size() > 0)
}